

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O3

bool __thiscall
ruckig::Profile::
check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double aUp,double aDown,double vMax,double vMin)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = (this->t)._M_elems[0];
  if (0.0 <= dVar5) {
    (this->t_sum)._M_elems[0] = dVar5;
    lVar2 = 1;
    do {
      dVar3 = (this->t)._M_elems[lVar2];
      if (dVar3 < 0.0) {
        return false;
      }
      dVar5 = dVar5 + dVar3;
      (this->t_sum)._M_elems[lVar2] = dVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
    if ((this->t_sum)._M_elems[6] <= 1000000000000.0) {
      (this->j)._M_elems[4] = 0.0;
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[2] = 0.0;
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[0] = 0.0;
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[6] = 0.0;
      dVar5 = (this->t)._M_elems[2];
      dVar3 = (this->t)._M_elems[4];
      dVar6 = (this->t)._M_elems[6];
      dVar1 = this->af;
      (this->a)._M_elems[0] = (double)(-(ulong)(0.0 < (this->t)._M_elems[0]) & (ulong)aUp);
      (this->a)._M_elems[1] = 0.0;
      (this->a)._M_elems[2] = (double)(-(ulong)(0.0 < dVar5) & (ulong)aDown);
      (this->a)._M_elems[3] = 0.0;
      (this->a)._M_elems[4] = (double)(-(ulong)(0.0 < dVar3) & (ulong)aUp);
      (this->a)._M_elems[5] = 0.0;
      (this->a)._M_elems[6] = (double)(-(ulong)(0.0 < dVar6) & (ulong)aDown);
      (this->a)._M_elems[7] = dVar1;
      this->direction = (uint)(vMax <= 0.0);
      dVar5 = vMin;
      if (0.0 < vMax) {
        dVar5 = vMax;
        vMax = vMin;
      }
      dVar3 = (this->p)._M_elems[0];
      lVar2 = -0x38;
      dVar6 = (this->v)._M_elems[0];
      do {
        dVar1 = *(double *)((long)(this->t_sum)._M_elems + lVar2);
        dVar7 = *(double *)((long)(this->a)._M_elems + lVar2 + 0x38) * dVar1;
        dVar8 = dVar7 + dVar6;
        *(double *)((long)(this->p)._M_elems + lVar2) = dVar8;
        dVar3 = dVar3 + (dVar7 * 0.5 + dVar6) * dVar1;
        *(double *)((long)(this->brake).t._M_elems + lVar2 + -8) = dVar3;
        lVar2 = lVar2 + 8;
        dVar6 = dVar8;
      } while (lVar2 != 0);
      this->control_signs = UDUD;
      this->limits = NONE;
      if ((ABS((this->p)._M_elems[7] - this->pf) < 1e-08) &&
         (ABS((this->v)._M_elems[7] - this->vf) < 1e-08)) {
        dVar5 = dVar5 + 1e-12;
        dVar3 = (this->v)._M_elems[2];
        if ((dVar3 <= dVar5) &&
           (((dVar6 = (this->v)._M_elems[3], dVar6 <= dVar5 &&
             (dVar1 = (this->v)._M_elems[4], dVar1 <= dVar5)) &&
            (dVar7 = (this->v)._M_elems[5], dVar7 <= dVar5)))) {
          dVar4 = vMax + -1e-12;
          dVar8 = (this->v)._M_elems[6];
          return (bool)((dVar4 <= dVar8 && (dVar4 <= dVar7 && (dVar4 <= dVar1 && dVar8 <= dVar5))) &
                       -(dVar4 <= dVar3) & -(dVar4 <= dVar6));
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_for_second_order(double aUp, double aDown, double vMax, double vMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        if constexpr (control_signs == ControlSigns::UDDU) {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aDown : 0), 0, (t[6] > 0 ? aUp : 0), af};
        } else {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aUp : 0), 0, (t[6] > 0 ? aDown : 0), af};
        }

        direction = (vMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double vUppLim = (direction == Profile::Direction::UP ? vMax : vMin) + v_eps;
        const double vLowLim = (direction == Profile::Direction::UP ? vMin : vMax) - v_eps;

        for (size_t i = 0; i < 7; ++i) {
            v[i+1] = v[i] + t[i] * a[i];
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(16) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(p.back() - pf) < p_precision && std::abs(v.back() - vf) < v_precision
            && v[2] <= vUppLim && v[3] <= vUppLim && v[4] <= vUppLim && v[5] <= vUppLim && v[6] <= vUppLim
            && v[2] >= vLowLim && v[3] >= vLowLim && v[4] >= vLowLim && v[5] >= vLowLim && v[6] >= vLowLim;
    }